

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::reportError
          (DOMLSSerializerImpl *this,DOMNode *errorNode,ErrorSeverity errorType,Codes toEmit)

{
  char cVar1;
  XMLMsgLoader *pXVar2;
  DOMLSException *this_00;
  DOMErrorImpl domError;
  DOMLocatorImpl locator;
  XMLCh errText [1024];
  
  pXVar2 = DOMImplementationImpl::getMsgLoader4DOM();
  (*pXVar2->_vptr_XMLMsgLoader[2])(pXVar2,(ulong)toEmit,errText,0x3ff);
  if (this->fErrorHandler == (DOMErrorHandler *)0x0) {
    cVar1 = '\x01';
    if (errorType == DOM_SEVERITY_WARNING) {
      return true;
    }
LAB_0028dc3e:
    this->fErrorCount = this->fErrorCount + 1;
    if (errorType == DOM_SEVERITY_FATAL_ERROR) goto LAB_0028dc5e;
  }
  else {
    DOMLocatorImpl::DOMLocatorImpl
              (&locator,0,0,errorNode,(XMLCh *)0x0,0xffffffffffffffff,0xffffffffffffffff);
    DOMErrorImpl::DOMErrorImpl(&domError,errorType,errText,&locator.super_DOMLocator);
    cVar1 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,&domError);
    DOMErrorImpl::~DOMErrorImpl(&domError);
    DOMLocatorImpl::~DOMLocatorImpl(&locator);
    if (errorType != DOM_SEVERITY_WARNING) goto LAB_0028dc3e;
  }
  if (cVar1 != '\0') {
    return true;
  }
LAB_0028dc5e:
  this_00 = (DOMLSException *)__cxa_allocate_exception(0x28);
  DOMLSException::DOMLSException(this_00,0x52,(short)toEmit,this->fMemoryManager);
  __cxa_throw(this_00,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
}

Assistant:

bool DOMLSSerializerImpl::reportError(const DOMNode* const    errorNode
                              , DOMError::ErrorSeverity errorType
                              , XMLDOMMsg::Codes        toEmit)
{
    const XMLSize_t msgSize = 1023;
    XMLCh errText[msgSize + 1];

    DOMImplementationImpl::getMsgLoader4DOM()->loadMsg(toEmit, errText, msgSize);

    bool toContinueProcess = true;   // default value for no error handler

    if (fErrorHandler)
    {
        DOMLocatorImpl  locator(0, 0, (DOMNode*) errorNode, 0);
        DOMErrorImpl    domError(errorType , errText, &locator);
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
    }

    if (errorType != DOMError::DOM_SEVERITY_WARNING)
        fErrorCount++;

    if (errorType == DOMError::DOM_SEVERITY_FATAL_ERROR || !toContinueProcess)
        throw DOMLSException(DOMLSException::SERIALIZE_ERR, toEmit, fMemoryManager);

    return toContinueProcess;
}